

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

int __thiscall MeCab::DecoderFeatureIndex::id(DecoderFeatureIndex *this,char *key)

{
  ostream *poVar1;
  char *in_RSI;
  long in_RDI;
  int n;
  uint64_t *result;
  uint64_t fp;
  unsigned_long *in_stack_ffffffffffffff90;
  unsigned_long *in_stack_ffffffffffffff98;
  unsigned_long *in_stack_ffffffffffffffa0;
  die local_2d;
  int local_2c;
  unsigned_long *local_28;
  uint64_t local_20;
  int local_4;
  
  strlen(in_RSI);
  local_20 = fingerprint((char *)in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
  local_28 = std::lower_bound<unsigned_long_const*,unsigned_long>
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90);
  if ((local_28 == (unsigned_long *)(*(long *)(in_RDI + 0x368) + *(long *)(in_RDI + 0x160) * 8)) ||
     (*local_28 != local_20)) {
    local_4 = -1;
  }
  else {
    local_2c = (int)((long)local_28 - *(long *)(in_RDI + 0x368) >> 3);
    if (*(uint64_t *)(*(long *)(in_RDI + 0x368) + (long)local_2c * 8) != local_20) {
      die::die(&local_2d);
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar1 = std::operator<<(poVar1,"(");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1be);
      poVar1 = std::operator<<(poVar1,") [");
      poVar1 = std::operator<<(poVar1,"key_[n] == fp");
      poVar1 = std::operator<<(poVar1,"] ");
      die::operator&(&local_2d,poVar1);
      die::~die((die *)0x112c9c);
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

int DecoderFeatureIndex::id(const char *key) {
  const uint64_t fp = fingerprint(key, std::strlen(key));
  const uint64_t *result = std::lower_bound(key_,
                                            key_ + maxid_,
                                            fp);
  if (result == key_ + maxid_ || *result != fp) {
    return -1;
  }
  const int n = static_cast<int>(result - key_);
  CHECK_DIE(key_[n] == fp);
  return n;
}